

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O2

char * __thiscall MeCab::ChunkFreeList<char>::alloc(ChunkFreeList<char> *this,size_t req)

{
  pointer ppVar1;
  pointer ppVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  char **ppcVar6;
  pair<unsigned_long,_char_*> local_30;
  
  ppVar1 = (this->freelist_).
           super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->freelist_).
           super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = this->li_;
  sVar4 = this->pi_;
  ppcVar6 = &ppVar1[uVar5].second;
  while( true ) {
    if ((ulong)((long)ppVar2 - (long)ppVar1 >> 4) <= uVar5) {
      uVar5 = this->default_size;
      if (this->default_size <= req) {
        uVar5 = req;
      }
      local_30.second = (char *)operator_new__(uVar5);
      local_30.first = uVar5;
      std::vector<std::pair<unsigned_long,char*>,std::allocator<std::pair<unsigned_long,char*>>>::
      emplace_back<std::pair<unsigned_long,char*>>
                ((vector<std::pair<unsigned_long,char*>,std::allocator<std::pair<unsigned_long,char*>>>
                  *)&this->freelist_,&local_30);
      ppVar1 = (this->freelist_).
               super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar4 = ((long)(this->freelist_).
                     super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4) - 1;
      this->li_ = sVar4;
      this->pi_ = this->pi_ + req;
      return ppVar1[sVar4].second;
    }
    if (sVar4 + req < ((pair<unsigned_long,_char_*> *)(ppcVar6 + -1))->first) break;
    uVar5 = uVar5 + 1;
    this->li_ = uVar5;
    this->pi_ = 0;
    ppcVar6 = ppcVar6 + 2;
    sVar4 = 0;
  }
  pcVar3 = *ppcVar6;
  this->pi_ = sVar4 + req;
  return pcVar3 + sVar4;
}

Assistant:

T* alloc(size_t req = 1) {
    while (li_ < freelist_.size()) {
      if ((pi_ + req) < freelist_[li_].first) {
        T *r = freelist_[li_].second + pi_;
        pi_ += req;
        return r;
      }
      li_++;
      pi_ = 0;
    }
    size_t _size = std::max(req, default_size);
    freelist_.push_back(std::make_pair(_size, new T[_size]));
    li_ = freelist_.size() - 1;
    pi_ += req;
    return freelist_[li_].second;
  }